

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

void anon_unknown.dwarf_85896::ProbeCaptureDeviceList(void)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  string names;
  undefined1 local_39;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_38 = &local_39;
  plVar2 = (long *)__tls_get_addr(&PTR_001b0f60);
  *plVar2 = (long)&local_38;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_001b0f90);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&(anonymous_namespace)::alc_config_once,__once_proxy);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  *plVar2 = 0;
  *puVar3 = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if ((anonymous_namespace)::CaptureFactory == (long *)0x0) {
    local_30 = 0;
    local_28 = 0;
    local_38 = &local_28;
    std::__cxx11::string::swap((string *)&local_38);
    if (local_38 == &local_28) goto LAB_0012da95;
  }
  else {
    (**(code **)(*(anonymous_namespace)::CaptureFactory + 0x10))
              (&local_38,(anonymous_namespace)::CaptureFactory,1);
    if (local_30 == 0) {
      std::__cxx11::string::push_back((char)&local_38);
    }
    std::__cxx11::string::swap((string *)&local_38);
    if (local_38 == &local_28) goto LAB_0012da95;
  }
  operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
LAB_0012da95:
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
  return;
}

Assistant:

void ProbeCaptureDeviceList()
{
    DO_INITCONFIG();

    std::lock_guard<std::recursive_mutex> _{ListLock};
    if(!CaptureFactory)
        decltype(alcCaptureDeviceList){}.swap(alcCaptureDeviceList);
    else
    {
        std::string names{CaptureFactory->probe(BackendType::Capture)};
        if(names.empty()) names += '\0';
        names.swap(alcCaptureDeviceList);
    }